

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_removeVariablesFromConnections_Test::~Connection_removeVariablesFromConnections_Test
          (Connection_removeVariablesFromConnections_Test *this)

{
  Connection_removeVariablesFromConnections_Test *this_local;
  
  ~Connection_removeVariablesFromConnections_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, removeVariablesFromConnections)
{
    // Initial model
    const std::string e1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\">\n"
        "    <variable name=\"variable3\"/>\n"
        "  </component>\n"
        "  <component name=\"component4\">\n"
        "    <variable name=\"variable4\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component4\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove variable4
    const std::string e2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\">\n"
        "    <variable name=\"variable3\"/>\n"
        "  </component>\n"
        "  <component name=\"component4\"/>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove variable3
    const std::string e3 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\"/>\n"
        "  <component name=\"component4\"/>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component2\">\n"
        "    <map_variables variable_1=\"variable2\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove variable2
    const std::string e4 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1_1\"/>\n"
        "    <variable name=\"variable1_2\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\"/>\n"
        "  <component name=\"component3\"/>\n"
        "  <component name=\"component4\"/>\n"
        "  <connection component_1=\"component1\" id=\"conId\">\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable2\"/>\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable3\"/>\n"
        "    <map_variables variable_1=\"variable1_1\" variable_2=\"variable4\" id=\"v11v4Id\"/>\n"
        "    <map_variables variable_1=\"variable1_2\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "</model>\n";

    // Remove all variables from component1 (variable1_1 and variable1_2)
    const std::string e5 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\"/>\n"
        "  <component name=\"component2\"/>\n"
        "  <component name=\"component3\"/>\n"
        "  <component name=\"component4\"/>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::ComponentPtr comp3 = libcellml::Component::create();
    libcellml::ComponentPtr comp4 = libcellml::Component::create();
    libcellml::VariablePtr v1_1 = libcellml::Variable::create();
    libcellml::VariablePtr v1_2 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    comp1->setName("component1");
    comp2->setName("component2");
    comp3->setName("component3");
    comp4->setName("component4");
    v1_1->setName("variable1_1");
    v1_2->setName("variable1_2");
    v2->setName("variable2");
    v3->setName("variable3");
    v4->setName("variable4");

    comp1->addVariable(v1_1);
    comp1->addVariable(v1_2);
    comp2->addVariable(v2);
    comp3->addVariable(v3);
    comp4->addVariable(v4);
    m->addComponent(comp1);
    m->addComponent(comp2);
    m->addComponent(comp3);
    m->addComponent(comp4);
    libcellml::Variable::addEquivalence(v1_1, v2);
    libcellml::Variable::addEquivalence(v1_2, v2);
    libcellml::Variable::setEquivalenceConnectionId(v1_2, v2, "conId");
    libcellml::Variable::addEquivalence(v1_1, v3);
    libcellml::Variable::addEquivalence(v1_1, v4);
    libcellml::Variable::setEquivalenceMappingId(v1_1, v4, "v11v4Id");
    libcellml::Variable::addEquivalence(v2, v3);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e1, a);

    comp4->removeVariable(v4);
    a = printer->printModel(m);
    EXPECT_EQ(e2, a);

    comp3->removeVariable("variable3");
    a = printer->printModel(m);
    EXPECT_EQ(e3, a);

    comp2->removeVariable(v2);
    a = printer->printModel(m);
    EXPECT_EQ(e4, a);

    comp1->removeAllVariables();
    a = printer->printModel(m);
    EXPECT_EQ(e5, a);
}